

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void yyStackOverflow(yyParser *yypParser)

{
  Parse *pPVar1;
  yyStackEntry *pyVar2;
  
  pyVar2 = yypParser->yytos;
  pPVar1 = yypParser->pParse;
  if (yypParser->yystack < pyVar2) {
    do {
      yypParser->yytos = pyVar2 + -1;
      yy_destructor(yypParser,pyVar2->major,&pyVar2->minor);
      pyVar2 = yypParser->yytos;
    } while (yypParser->yystack < pyVar2);
  }
  sqlite3OomFault(pPVar1->db);
  yypParser->pParse = pPVar1;
  return;
}

Assistant:

static void yyStackOverflow(yyParser *yypParser){
   sqlite3ParserARG_FETCH
   sqlite3ParserCTX_FETCH
#ifndef NDEBUG
   if( yyTraceFILE ){
     fprintf(yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
   }
#endif
   while( yypParser->yytos>yypParser->yystack ) yy_pop_parser_stack(yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/

  sqlite3OomFault(pParse->db);
/******** End %stack_overflow code ********************************************/
   sqlite3ParserARG_STORE /* Suppress warning about unused %extra_argument var */
   sqlite3ParserCTX_STORE
}